

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ItemSimilarityRecommender::SerializeWithCachedSizes
          (ItemSimilarityRecommender *this,CodedOutputStream *output)

{
  int iVar1;
  string *psVar2;
  size_type sVar3;
  Type *value;
  int index;
  
  iVar1 = (this->itemitemsimilarities_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    index = 0;
    do {
      value = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ItemSimilarityRecommender_SimilarItems>::TypeHandler>
                        (&(this->itemitemsimilarities_).super_RepeatedPtrFieldBase,index);
      google::protobuf::internal::WireFormatLite::WriteMessage(1,&value->super_MessageLite,output);
      index = index + 1;
    } while (iVar1 != index);
  }
  if (this != (ItemSimilarityRecommender *)&_ItemSimilarityRecommender_default_instance_ &&
      this->itemstringids_ != (StringVector *)0x0) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&this->itemstringids_->super_MessageLite,output);
  }
  if (this->itemint64ids_ != (Int64Vector *)0x0 &&
      this != (ItemSimilarityRecommender *)&_ItemSimilarityRecommender_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (3,&this->itemint64ids_->super_MessageLite,output);
  }
  psVar2 = (this->iteminputfeaturename_).ptr_;
  sVar3 = psVar2->_M_string_length;
  if (sVar3 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)sVar3,SERIALIZE,
               "CoreML.Specification.ItemSimilarityRecommender.itemInputFeatureName");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (10,(this->iteminputfeaturename_).ptr_,output);
  }
  psVar2 = (this->numrecommendationsinputfeaturename_).ptr_;
  sVar3 = psVar2->_M_string_length;
  if (sVar3 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)sVar3,SERIALIZE,
               "CoreML.Specification.ItemSimilarityRecommender.numRecommendationsInputFeatureName");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (0xb,(this->numrecommendationsinputfeaturename_).ptr_,output);
  }
  psVar2 = (this->itemrestrictioninputfeaturename_).ptr_;
  sVar3 = psVar2->_M_string_length;
  if (sVar3 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)sVar3,SERIALIZE,
               "CoreML.Specification.ItemSimilarityRecommender.itemRestrictionInputFeatureName");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (0xc,(this->itemrestrictioninputfeaturename_).ptr_,output);
  }
  psVar2 = (this->itemexclusioninputfeaturename_).ptr_;
  sVar3 = psVar2->_M_string_length;
  if (sVar3 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)sVar3,SERIALIZE,
               "CoreML.Specification.ItemSimilarityRecommender.itemExclusionInputFeatureName");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (0xd,(this->itemexclusioninputfeaturename_).ptr_,output);
  }
  psVar2 = (this->recommendeditemlistoutputfeaturename_).ptr_;
  sVar3 = psVar2->_M_string_length;
  if (sVar3 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)sVar3,SERIALIZE,
               "CoreML.Specification.ItemSimilarityRecommender.recommendedItemListOutputFeatureName"
              );
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (0x14,(this->recommendeditemlistoutputfeaturename_).ptr_,output);
  }
  psVar2 = (this->recommendeditemscoreoutputfeaturename_).ptr_;
  sVar3 = psVar2->_M_string_length;
  if (sVar3 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)sVar3,SERIALIZE,
               "CoreML.Specification.ItemSimilarityRecommender.recommendedItemScoreOutputFeatureName"
              );
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (0x15,(this->recommendeditemscoreoutputfeaturename_).ptr_,output);
    return;
  }
  return;
}

Assistant:

void ItemSimilarityRecommender::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ItemSimilarityRecommender)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .CoreML.Specification.ItemSimilarityRecommender.SimilarItems itemItemSimilarities = 1;
  for (unsigned int i = 0, n = this->itemitemsimilarities_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, this->itemitemsimilarities(i), output);
  }

  // .CoreML.Specification.StringVector itemStringIds = 2;
  if (this->has_itemstringids()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *this->itemstringids_, output);
  }

  // .CoreML.Specification.Int64Vector itemInt64Ids = 3;
  if (this->has_itemint64ids()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      3, *this->itemint64ids_, output);
  }

  // string itemInputFeatureName = 10;
  if (this->iteminputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->iteminputfeaturename().data(), this->iteminputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.ItemSimilarityRecommender.itemInputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      10, this->iteminputfeaturename(), output);
  }

  // string numRecommendationsInputFeatureName = 11;
  if (this->numrecommendationsinputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->numrecommendationsinputfeaturename().data(), this->numrecommendationsinputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.ItemSimilarityRecommender.numRecommendationsInputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      11, this->numrecommendationsinputfeaturename(), output);
  }

  // string itemRestrictionInputFeatureName = 12;
  if (this->itemrestrictioninputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->itemrestrictioninputfeaturename().data(), this->itemrestrictioninputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.ItemSimilarityRecommender.itemRestrictionInputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      12, this->itemrestrictioninputfeaturename(), output);
  }

  // string itemExclusionInputFeatureName = 13;
  if (this->itemexclusioninputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->itemexclusioninputfeaturename().data(), this->itemexclusioninputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.ItemSimilarityRecommender.itemExclusionInputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      13, this->itemexclusioninputfeaturename(), output);
  }

  // string recommendedItemListOutputFeatureName = 20;
  if (this->recommendeditemlistoutputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->recommendeditemlistoutputfeaturename().data(), this->recommendeditemlistoutputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.ItemSimilarityRecommender.recommendedItemListOutputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      20, this->recommendeditemlistoutputfeaturename(), output);
  }

  // string recommendedItemScoreOutputFeatureName = 21;
  if (this->recommendeditemscoreoutputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->recommendeditemscoreoutputfeaturename().data(), this->recommendeditemscoreoutputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.ItemSimilarityRecommender.recommendedItemScoreOutputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      21, this->recommendeditemscoreoutputfeaturename(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ItemSimilarityRecommender)
}